

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
::
emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<int&&>>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
          *this,int *key,size_t hashval,piecewise_construct_t *args,tuple<int_&&> *args_1,
          tuple<int_&&> *args_2)

{
  Inner *this_00;
  int *piVar1;
  slot_type *psVar2;
  size_t sVar3;
  long lVar4;
  size_t i;
  ctrl_t *pcVar5;
  ctrl_t *pcVar6;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_01;
  bool bVar7;
  WriteLock local_40;
  
  lVar4 = (ulong)(((uint)(hashval >> 0x18) & 0xff ^
                  (uint)hashval >> 8 ^ (uint)(hashval >> 0x10) & 0xffff) & 0xf) * 0x58;
  this_00 = (Inner *)(this + lVar4);
  this_01 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
             *)(this + lVar4 + 0x28);
  local_40.m_ = (mutex_type *)this_00;
  std::mutex::lock((mutex *)this_00);
  local_40.locked_ = true;
  i = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::_find_key<int>(this_01,key,hashval);
  bVar7 = i == 0xffffffffffffffff;
  if (bVar7) {
    i = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::prepare_insert(this_01,hashval);
    psVar2 = (this_00->set_).slots_;
    piVar1 = (args_2->super__Tuple_impl<0UL,_int_&&>).super__Head_base<0UL,_int_&&,_false>.
             _M_head_impl;
    psVar2[i].value.first =
         *(args_1->super__Tuple_impl<0UL,_int_&&>).super__Head_base<0UL,_int_&&,_false>._M_head_impl
    ;
    *(int *)((long)psVar2 + i * 8 + 4) = *piVar1;
    raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::set_ctrl(this_01,i,(byte)hashval & 0x7f);
    pcVar5 = this_01->ctrl_;
    pcVar6 = pcVar5 + i;
  }
  else {
    pcVar5 = (this_00->set_).ctrl_;
    pcVar6 = pcVar5 + i;
  }
  psVar2 = (this_00->set_).slots_;
  sVar3 = (this_00->set_).capacity_;
  (__return_storage_ptr__->first).inner_ = this_00;
  (__return_storage_ptr__->first).inner_end_ = (Inner *)(this + 0x580);
  (__return_storage_ptr__->first).it_.ctrl_ = pcVar6;
  (__return_storage_ptr__->first).it_.field_1.slot_ = psVar2 + i;
  (__return_storage_ptr__->first).it_end_.ctrl_ = pcVar5 + sVar3;
  __return_storage_ptr__->second = bVar7;
  LockableBaseImpl<std::mutex>::WriteLock::~WriteLock(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable_with_hash(const K& key, size_t hashval, Args&&... args)
    {
        Inner& inner   = sets_[subidx(hashval)];
        auto&  set     = inner.set_;
        UniqueLock m(inner);
        
        size_t offset = set._find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = set.prepare_insert(hashval);
            set.emplace_at(offset, std::forward<Args>(args)...);
            set.set_ctrl(offset, H2(hashval));
            return make_rv(&inner, {set.iterator_at(offset), true});
        }
        return make_rv(&inner, {set.iterator_at(offset), false});
    }